

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_file_priority
          (torrent *this,file_index_t index,download_priority_t prio)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  file_storage *this_01;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *psVar3;
  mapped_type *pmVar4;
  value_type *pvVar5;
  undefined4 extraout_var;
  bool local_b2;
  bool local_b1;
  enable_shared_from_this<libtorrent::aux::torrent> local_a0;
  function<void_(const_libtorrent::storage_error_&,_libtorrent::aux::container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>)>
  local_90;
  container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  local_70;
  uint local_54;
  int local_50;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_3c;
  undefined1 local_38 [8];
  vector<download_priority_t,_file_index_t> new_priority;
  torrent *this_local;
  download_priority_t prio_local;
  file_index_t index_local;
  
  this_local._3_1_ = prio.m_val;
  this_local._4_4_ = index.m_val;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::strong_typedef
            ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
             ((long)&new_priority.
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     .
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
  bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                    ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&this_local + 4),
                     (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                     ((long)&new_priority.
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_b1 = true;
  if (!bVar1) {
    bVar1 = valid_metadata(this);
    local_b2 = false;
    if (bVar1) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      this_01 = torrent_info::files(this_00);
      new_priority.
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = file_storage::end_file(this_01);
      local_b2 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                           ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                            ((long)&this_local + 4),
                            (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                            &new_priority.
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_b1 = local_b2;
  }
  if (local_b1 == false) {
    psVar3 = ::std::
             clamp<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>
                       ((strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                        ((long)&this_local + 3),
                        (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                        &dont_download,
                        (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                        &top_priority);
    this_local._3_1_ = psVar3->m_val;
    if (((byte)this->field_0x606 >> 5 & 1) == 0) {
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::container_wrapper((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                           *)local_38,&this->m_file_priority);
      local_3c = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                 ::end_index((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                              *)local_38);
      bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<=
                        (&local_3c,
                         (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                         ((long)&this_local + 4));
      if (bVar1) {
        iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
        container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
        ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                            *)local_38,iVar2 + 1,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&default_priority);
      }
      local_50 = this_local._4_4_;
      pvVar5 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                             *)local_38,
                            (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                            this_local._4_4_);
      pvVar5->m_val = this_local._3_1_;
      bVar1 = storage_holder::operator_cast_to_bool(&this->m_storage);
      if (bVar1) {
        this->field_0x606 = this->field_0x606 | 0x20;
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        local_54 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
        container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
        ::container_wrapper(&local_70,
                            (container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                             *)local_38);
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_a0);
        ::std::
        function<void(libtorrent::storage_error_const&,libtorrent::aux::container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>)>
        ::
        function<libtorrent::aux::torrent::set_file_priority(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>)::__0,void>
                  ((function<void(libtorrent::storage_error_const&,libtorrent::aux::container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>)>
                    *)&local_90,(anon_class_16_1_89917c4a *)&local_a0);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x60))
                  ((long *)CONCAT44(extraout_var,iVar2),local_54,&local_70,&local_90);
        ::std::
        function<void_(const_libtorrent::storage_error_&,_libtorrent::aux::container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>)>
        ::~function(&local_90);
        set_file_priority(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>)
        ::$_0::~__0((__0 *)&local_a0);
        container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
        ::~container_wrapper(&local_70);
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      else {
        container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
        ::operator=(&this->m_file_priority,
                    (container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                     *)local_38);
        set_need_save_resume(this,(resume_data_flags_t)0x20);
      }
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::~container_wrapper
                ((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                  *)local_38);
    }
    else {
      pmVar4 = ::std::
               map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
               ::operator[](&this->m_deferred_file_priorities,(key_type *)((long)&this_local + 4));
      pmVar4->m_val = this_local._3_1_;
    }
  }
  return;
}

Assistant:

void torrent::set_file_priority(file_index_t const index
		, download_priority_t prio)
	{
		INVARIANT_CHECK;

		// setting file priority on a torrent that doesn't have metadata yet is
		// similar to having passed in file priorities through add_torrent_params.
		// we store the priorities in m_file_priority until we get the metadata
		if (index < file_index_t(0)
			|| (valid_metadata() && index >= m_torrent_file->files().end_file()))
		{
			return;
		}

		prio = std::clamp(prio, dont_download, top_priority);

		if (m_outstanding_file_priority)
		{
			m_deferred_file_priorities[index] = prio;
			return;
		}

		auto new_priority = m_file_priority;
		if (new_priority.end_index() <= index)
		{
			// any unallocated slot is assumed to have the default priority
			new_priority.resize(static_cast<int>(index) + 1, default_priority);
		}

		new_priority[index] = prio;

		// storage may be nullptr during shutdown
		if (m_storage)
		{
			m_outstanding_file_priority = true;
			ADD_OUTSTANDING_ASYNC("file_priority");
			m_ses.disk_thread().async_set_file_priority(m_storage
				, std::move(new_priority)
				, [self = shared_from_this()] (storage_error const& ec, aux::vector<download_priority_t, file_index_t> p)
				{ self->on_file_priority(ec, std::move(p)); });
			m_ses.deferred_submit_jobs();
		}
		else
		{
			m_file_priority = std::move(new_priority);
			set_need_save_resume(torrent_handle::if_config_changed);
		}
	}